

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shque.c
# Opt level: O1

QcShmQue * qc_shqueue_attach(char *shm_name,char *que_name,QcErr *err)

{
  QcShm *qcShm;
  QcShmQue *pQVar1;
  
  qcShm = qc_shm_open(shm_name,err);
  if (qcShm != (QcShm *)0x0) {
    pQVar1 = shm_queue_find(qcShm,que_name,err);
    if (pQVar1 != (QcShmQue *)0x0) {
      return pQVar1;
    }
    qc_shm_close(qcShm);
  }
  return (QcShmQue *)0x0;
}

Assistant:

QcShmQue* qc_shqueue_attach(const char *shm_name, const char *que_name, QcErr *err)
{
    QcShm* qcShm;
    QcShmQue* qcShmQue;

    qcShm = qc_shm_open(shm_name, err);
    if (NULL == qcShm)
    {
        return NULL;
    }

    qcShmQue = shm_queue_find(qcShm, que_name, err);
    if(NULL == qcShmQue)
    {
        qc_shm_close(qcShm);
        return NULL;
    }

    return qcShmQue;
}